

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCBoolean.cpp
# Opt level: O1

void Assimp::IFC::ProcessBoolean(IfcBooleanResult *boolean,TempMesh *result,ConversionData *conv)

{
  _func_int **pp_Var1;
  int iVar2;
  long lVar3;
  long *plVar4;
  undefined8 *puVar5;
  IfcHalfSpaceSolid *hs;
  IfcExtrudedAreaSolid *as;
  IfcBooleanResult *boolean_00;
  IfcSweptAreaSolid *swept;
  IfcPolygonalBoundedHalfSpace *hs_00;
  ConversionData *pCVar6;
  size_type *psVar7;
  pointer paVar8;
  char *unaff_retaddr;
  TempMesh first_operand;
  allocator local_1e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  pointer local_1c8 [2];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  pointer local_198;
  pointer puStack_190;
  pointer local_188;
  pointer puStack_180;
  ios_base local_138 [264];
  
  pp_Var1 = (boolean->super_IfcGeometricRepresentationItem).super_IfcRepresentationItem.
            super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
            _vptr_ObjectHelper;
  pCVar6 = (ConversionData *)0xffffffffffffffff;
  lVar3 = __dynamic_cast((_func_int *)
                         ((long)&(boolean->super_IfcGeometricRepresentationItem).
                                 super_IfcRepresentationItem.
                                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>
                                 ._vptr_ObjectHelper + (long)pp_Var1[-3]),&STEP::Object::typeinfo,
                         &Schema_2x3::IfcBooleanResult::typeinfo);
  if (lVar3 == 0) {
    std::__cxx11::string::string
              ((string *)local_1c8,
               *(char **)(&(boolean->super_IfcGeometricRepresentationItem).
                           super_IfcRepresentationItem.
                           super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                           field_0x10 + (long)pp_Var1[-3]),&local_1e9);
    puVar5 = (undefined8 *)std::__cxx11::string::replace((ulong)local_1c8,0,(char *)0x0,0x6fee09);
    psVar7 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1e8.field_2._M_allocated_capacity = *psVar7;
      local_1e8.field_2._8_8_ = puVar5[3];
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    }
    else {
      local_1e8.field_2._M_allocated_capacity = *psVar7;
      local_1e8._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_1e8._M_string_length = puVar5[1];
    *puVar5 = psVar7;
    puVar5[1] = 0;
    *(undefined1 *)(puVar5 + 2) = 0;
    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
    basic_formatter<std::__cxx11::string>
              ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_1a8,
               &local_1e8);
    LogFunctions<Assimp::IFCImporter>::LogWarn((format *)local_1a8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p);
    }
    paVar8 = local_1c8[0];
    if (local_1c8[0] == (pointer)local_1b8) {
      return;
    }
    goto LAB_005d9498;
  }
  iVar2 = std::__cxx11::string::compare((char *)(lVar3 + 0x30));
  if (iVar2 != 0) {
    local_1c8[0] = (pointer)local_1b8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1c8,*(long *)(lVar3 + 0x30),
               *(long *)(lVar3 + 0x38) + *(long *)(lVar3 + 0x30));
    plVar4 = (long *)std::__cxx11::string::replace((ulong)local_1c8,0,(char *)0x0,0x6fed47);
    psVar7 = (size_type *)(plVar4 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar4 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_1e8.field_2._M_allocated_capacity = *psVar7;
      local_1e8.field_2._8_8_ = plVar4[3];
      local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    }
    else {
      local_1e8.field_2._M_allocated_capacity = *psVar7;
      local_1e8._M_dataplus._M_p = (pointer)*plVar4;
    }
    local_1e8._M_string_length = plVar4[1];
    *plVar4 = (long)psVar7;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
    Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::
    basic_formatter<std::__cxx11::string>
              ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)local_1a8,
               &local_1e8);
    LogFunctions<Assimp::IFCImporter>::LogWarn((format *)local_1a8);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    std::ios_base::~ios_base(local_138);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p);
    }
    paVar8 = local_1c8[0];
    if (local_1c8[0] == (pointer)local_1b8) {
      return;
    }
    goto LAB_005d9498;
  }
  hs = STEP::EXPRESS::DataType::ResolveSelectPtr<Assimp::IFC::Schema_2x3::IfcHalfSpaceSolid>
                 (*(DataType **)(lVar3 + 0x60),conv->db);
  as = STEP::EXPRESS::DataType::ResolveSelectPtr<Assimp::IFC::Schema_2x3::IfcExtrudedAreaSolid>
                 (*(DataType **)(lVar3 + 0x60),conv->db);
  if (hs == (IfcHalfSpaceSolid *)0x0 && as == (IfcExtrudedAreaSolid *)0x0) {
    LogFunctions<Assimp::IFCImporter>::LogError(unaff_retaddr);
    return;
  }
  local_188 = (pointer)0x0;
  puStack_180 = (pointer)0x0;
  local_198 = (pointer)0x0;
  puStack_190 = (pointer)0x0;
  local_1a8._0_8_ = (pointer)0x0;
  local_1a8._8_8_ = (pointer)0x0;
  boolean_00 = STEP::EXPRESS::DataType::ResolveSelectPtr<Assimp::IFC::Schema_2x3::IfcBooleanResult>
                         (*(DataType **)(lVar3 + 0x50),conv->db);
  if (boolean_00 == (IfcBooleanResult *)0x0) {
    swept = STEP::EXPRESS::DataType::ResolveSelectPtr<Assimp::IFC::Schema_2x3::IfcSweptAreaSolid>
                      (*(DataType **)(lVar3 + 0x50),conv->db);
    if (swept != (IfcSweptAreaSolid *)0x0) {
      ProcessSweptAreaSolid(swept,(TempMesh *)local_1a8,conv);
      goto LAB_005d957f;
    }
    LogFunctions<Assimp::IFCImporter>::LogError((char *)0x5d957a);
  }
  else {
    ProcessBoolean(boolean_00,(TempMesh *)local_1a8,conv);
LAB_005d957f:
    if (hs == (IfcHalfSpaceSolid *)0x0) {
      ProcessBooleanExtrudedAreaSolidDifference(as,result,(TempMesh *)local_1a8,conv);
    }
    else {
      hs_00 = STEP::EXPRESS::DataType::
              ResolveSelectPtr<Assimp::IFC::Schema_2x3::IfcPolygonalBoundedHalfSpace>
                        (*(DataType **)(lVar3 + 0x60),conv->db);
      if (hs_00 == (IfcPolygonalBoundedHalfSpace *)0x0) {
        ProcessBooleanHalfSpaceDifference(hs,result,(TempMesh *)local_1a8,pCVar6);
      }
      else {
        ProcessPolygonalBoundedBooleanHalfSpaceDifference(hs_00,result,(TempMesh *)local_1a8,conv);
      }
    }
  }
  if (puStack_190 != (pointer)0x0) {
    operator_delete(puStack_190);
  }
  paVar8 = (pointer)local_1a8._0_8_;
  if ((pointer)local_1a8._0_8_ == (pointer)0x0) {
    return;
  }
LAB_005d9498:
  operator_delete(paVar8);
  return;
}

Assistant:

void ProcessBoolean(const Schema_2x3::IfcBooleanResult& boolean, TempMesh& result, ConversionData& conv)
{
    // supported CSG operations:
    //   DIFFERENCE
    if(const Schema_2x3::IfcBooleanResult* const clip = boolean.ToPtr<Schema_2x3::IfcBooleanResult>()) {
        if(clip->Operator != "DIFFERENCE") {
            IFCImporter::LogWarn("encountered unsupported boolean operator: " + (std::string)clip->Operator);
            return;
        }

        // supported cases (1st operand):
        //  IfcBooleanResult -- call ProcessBoolean recursively
        //  IfcSweptAreaSolid -- obtain polygonal geometry first

        // supported cases (2nd operand):
        //  IfcHalfSpaceSolid -- easy, clip against plane
        //  IfcExtrudedAreaSolid -- reduce to an instance of the quadrify() algorithm


        const Schema_2x3::IfcHalfSpaceSolid* const hs = clip->SecondOperand->ResolveSelectPtr<Schema_2x3::IfcHalfSpaceSolid>(conv.db);
        const Schema_2x3::IfcExtrudedAreaSolid* const as = clip->SecondOperand->ResolveSelectPtr<Schema_2x3::IfcExtrudedAreaSolid>(conv.db);
        if(!hs && !as) {
            IFCImporter::LogError("expected IfcHalfSpaceSolid or IfcExtrudedAreaSolid as second clipping operand");
            return;
        }

        TempMesh first_operand;
        if(const Schema_2x3::IfcBooleanResult* const op0 = clip->FirstOperand->ResolveSelectPtr<Schema_2x3::IfcBooleanResult>(conv.db)) {
            ProcessBoolean(*op0,first_operand,conv);
        }
        else if (const Schema_2x3::IfcSweptAreaSolid* const swept = clip->FirstOperand->ResolveSelectPtr<Schema_2x3::IfcSweptAreaSolid>(conv.db)) {
            ProcessSweptAreaSolid(*swept,first_operand,conv);
        }
        else {
            IFCImporter::LogError("expected IfcSweptAreaSolid or IfcBooleanResult as first clipping operand");
            return;
        }

        if(hs) {

            const Schema_2x3::IfcPolygonalBoundedHalfSpace* const hs_bounded = clip->SecondOperand->ResolveSelectPtr<Schema_2x3::IfcPolygonalBoundedHalfSpace>(conv.db);
            if (hs_bounded) {
                ProcessPolygonalBoundedBooleanHalfSpaceDifference(hs_bounded, result, first_operand, conv);
            }
            else {
                ProcessBooleanHalfSpaceDifference(hs, result, first_operand, conv);
            }
        }
        else {
            ProcessBooleanExtrudedAreaSolidDifference(as, result, first_operand, conv);
        }
    }
    else {
        IFCImporter::LogWarn("skipping unknown IfcBooleanResult entity, type is " + boolean.GetClassName());
    }
}